

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp.c
# Opt level: O2

int csp_rdp_close_internal(csp_conn_t *conn,uint8_t closed_by,_Bool send_rst)

{
  csp_rdp_state_t cVar1;
  byte bVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  
  cVar1 = (conn->rdp).state;
  iVar6 = 0;
  if (cVar1 != RDP_CLOSED) {
    bVar2 = (conn->rdp).closed_by | closed_by;
    (conn->rdp).closed_by = bVar2;
    if (cVar1 != RDP_CLOSE_WAIT) {
      (conn->rdp).state = RDP_CLOSE_WAIT;
      uVar3 = csp_get_ms();
      conn->timestamp = uVar3;
      if (send_rst) {
        csp_rdp_send_cmp(conn,(csp_packet_t *)0x0,5,(uint)(conn->rdp).snd_nxt,
                         (uint)(conn->rdp).rcv_cur);
      }
      if (1 < csp_dbg_rdp_print) {
        pcVar5 = "";
        if (send_rst) {
          pcVar5 = ", sent RST";
        }
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x)%s -> CLOSE_WAIT\n\x1b[0m",conn,closed_by
                       ,pcVar5);
      }
      csp_bin_sem_post(&(conn->rdp).tx_wait);
      bVar2 = (conn->rdp).closed_by;
    }
    if (bVar2 == 7) {
      if (1 < csp_dbg_rdp_print) {
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x) -> CLOSED\n\x1b[0m",conn,closed_by);
      }
      (conn->rdp).state = RDP_CLOSED;
      (conn->rdp).closed_by = '\0';
    }
    else {
      iVar6 = -0xc;
      if (1 < csp_dbg_rdp_print) {
        pcVar5 = " userspace";
        if ((bVar2 & 1) != 0) {
          pcVar5 = "";
        }
        pcVar7 = " protocol";
        if ((bVar2 & 2) != 0) {
          pcVar7 = "";
        }
        pcVar4 = " timeout";
        if ((bVar2 & 4) != 0) {
          pcVar4 = "";
        }
        csp_print_func("\x1b[34mRDP %p: csp_rdp_close(0x%x) != %x, waiting for:%s%s%s\n\x1b[0m",conn
                       ,closed_by,(ulong)bVar2,pcVar5,pcVar7,pcVar4);
      }
    }
  }
  return iVar6;
}

Assistant:

static int csp_rdp_close_internal(csp_conn_t * conn, uint8_t closed_by, bool send_rst) {

	if (conn->rdp.state == RDP_CLOSED) {
		return CSP_ERR_NONE;
	}

	conn->rdp.closed_by |= closed_by;

	/* If connection is open, send reset */
	if (conn->rdp.state != RDP_CLOSE_WAIT) {
		conn->rdp.state = RDP_CLOSE_WAIT;
		conn->timestamp = csp_get_ms();
		if (send_rst) {
			csp_rdp_send_cmp(conn, NULL, RDP_ACK | RDP_RST, conn->rdp.snd_nxt, conn->rdp.rcv_cur);
		}
		csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x)%s -> CLOSE_WAIT\n", (void *)conn, closed_by, send_rst ? ", sent RST" : "");
		csp_bin_sem_post(&conn->rdp.tx_wait);  // wake up any pendng Tx
	}

	if (conn->rdp.closed_by != CSP_RDP_CLOSED_BY_ALL) {
		csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x) != %x, waiting for:%s%s%s\n",
						 (void *)conn, closed_by, conn->rdp.closed_by,
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_USERSPACE) ? "" : " userspace",
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_PROTOCOL) ? "" : " protocol",
						 (conn->rdp.closed_by & CSP_RDP_CLOSED_BY_TIMEOUT) ? "" : " timeout");
		return CSP_ERR_AGAIN;
	}

	csp_rdp_protocol("RDP %p: csp_rdp_close(0x%x) -> CLOSED\n", (void *)conn, closed_by);
	conn->rdp.state = RDP_CLOSED;
	conn->rdp.closed_by = 0;
	return CSP_ERR_NONE;
}